

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O0

bool __thiscall
GlobOpt::CSEOptimize
          (GlobOpt *this,BasicBlock *block,Instr **instrRef,Value **pSrc1Val,Value **pSrc2Val,
          Value **pSrc1IndirIndexVal,bool intMathExprOnly)

{
  OpCode OVar1;
  Value *pVVar2;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  Instr *instr_00;
  code *pcVar3;
  bool bVar4;
  bool isSrcUnsigned;
  BOOLEAN BVar5;
  IRType IVar6;
  IRType IVar7;
  uint uVar8;
  ValueNumber VVar9;
  ValueNumber VVar10;
  uint uVar11;
  undefined4 *puVar12;
  Opnd *pOVar13;
  RegOpnd *pRVar14;
  ValueInfo *pVVar15;
  SymOpnd *pSVar16;
  StackSym *pSVar17;
  StackSym *symSrc;
  JITTimeFunctionBody *pJVar18;
  char16 *pcVar19;
  char16 *pcVar20;
  AddrOpnd *pAVar21;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar22;
  Var address;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar23;
  Instr *pIVar24;
  Instr *originalInstr;
  int local_140;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_13a;
  int32 intConstantValue;
  Opnd *cseOpnd;
  Value *dstVal;
  Opnd *dst;
  StackSym *varSym2;
  Opnd *src2_1;
  StackSym *varSym1;
  Opnd *src1_2;
  StackSym *sym2;
  Opnd *src2;
  StackSym *sym1;
  Opnd *src1_1;
  PropertySymOpnd *pPStack_d8;
  bool needsBailOnImplicitCall;
  PropertySymOpnd *propOpnd;
  Opnd *src1;
  Value *pVStack_c0;
  int32 intConstantValue_1;
  Value *symStoreVal;
  Value *val;
  Sym *symStore;
  ValueInfo *valueInfo;
  Value **local_98;
  Value **pVal;
  IntMathExprAttributes local_88;
  DstIsIntOrNumberAttributes local_84;
  IndirOpnd *local_80;
  IndirOpnd *arrayOpnd;
  ExprAttributes local_70;
  ExprHash hash;
  ExprAttributes exprAttributes;
  bool isArray;
  Value *src1IndirIndexVal;
  Value *src2Val;
  Value *src1Val;
  Instr **instr;
  bool intMathExprOnly_local;
  Value **pSrc1IndirIndexVal_local;
  Value **pSrc2Val_local;
  Value **pSrc1Val_local;
  Instr **instrRef_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  
  if (instrRef == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                       ,0x1d5,"(instrRef)","instrRef");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  if (*instrRef == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                       ,0x1d7,"(instr)","instr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  bVar4 = DoCSE(this);
  if (!bVar4) {
    return false;
  }
  src2Val = *pSrc1Val;
  src1IndirIndexVal = *pSrc2Val;
  pVVar2 = *pSrc1IndirIndexVal;
  hash._3_1_ = 0;
  ExprAttributes::ExprAttributes(&local_70,0);
  ExprHash::ExprHash((ExprHash *)((long)&arrayOpnd + 4));
  OVar1 = (*instrRef)->m_opcode;
  if ((((OVar1 == Neg_A) || ((ushort)(OVar1 - Add_A) < 2)) || ((ushort)(OVar1 - Mul_A) < 2)) ||
     ((OVar1 == Sub_A || (OVar1 == ShrU_A)))) {
    if ((intMathExprOnly) &&
       (((*(uint *)&this->field_0xf4 >> 2 & 1) == 0 && ((*(uint *)&this->field_0xf4 >> 3 & 1) == 0))
       )) {
      return false;
    }
    IntMathExprAttributes::IntMathExprAttributes
              (&local_88,(bool)((byte)(*(uint *)&this->field_0xf4 >> 2) & 1),
               (bool)((byte)(*(uint *)&this->field_0xf4 >> 3) & 1));
    local_70 = local_88.super_ExprAttributes.attributes;
  }
  else if (OVar1 == LdElemI_A) {
LAB_005fd4a6:
    if (intMathExprOnly) {
      return false;
    }
    pOVar13 = IR::Instr::GetSrc1(*instrRef);
    local_80 = IR::Opnd::AsIndirOpnd(pOVar13);
    pRVar14 = IR::IndirOpnd::GetBaseOpnd(local_80);
    src2Val = GlobOptBlockData::FindValue(&block->globOptData,&pRVar14->m_sym->super_Sym);
    src1IndirIndexVal = pVVar2;
    if (pVVar2 == (Value *)0x0) {
      pRVar14 = IR::IndirOpnd::GetIndexOpnd(local_80);
      if (pRVar14 == (RegOpnd *)0x0) {
        return false;
      }
      pRVar14 = IR::IndirOpnd::GetIndexOpnd(local_80);
      src1IndirIndexVal =
           GlobOptBlockData::FindValue(&block->globOptData,&pRVar14->m_sym->super_Sym);
    }
    pVVar15 = ::Value::GetValueInfo(src2Val);
    bVar4 = ValueType::IsLikelyOptimizedVirtualTypedArray(&pVVar15->super_ValueType);
    if (bVar4) {
      DstIsIntOrNumberAttributes::DstIsIntOrNumberAttributes
                (&local_84,
                 (bool)(((byte)((ushort)*(undefined2 *)&(*instrRef)->field_0x36 >> 0xe) & 1 ^ 0xff)
                       & 1),
                 (bool)(((byte)((ushort)*(undefined2 *)&(*instrRef)->field_0x36 >> 0xf) ^ 0xff) & 1)
                );
      local_70 = local_84.super_ExprAttributes.attributes;
    }
    hash._3_1_ = 1;
  }
  else if ((ushort)(OVar1 - Conv_Prim) < 2) {
    pOVar13 = IR::Instr::GetDst(*instrRef);
    bVar4 = IR::Opnd::IsUnsigned(pOVar13);
    pOVar13 = IR::Instr::GetSrc1(*instrRef);
    isSrcUnsigned = IR::Opnd::IsUnsigned(pOVar13);
    ConvAttributes::ConvAttributes((ConvAttributes *)((long)&pVal + 4),bVar4,isSrcUnsigned);
    local_70.attributes = pVal._4_4_;
  }
  else {
    if (OVar1 == LdArrViewElem) goto LAB_005fd4a6;
    if (intMathExprOnly) {
      return false;
    }
  }
  pVal._0_4_ = local_70.attributes;
  bVar4 = GetHash(this,*instrRef,src2Val,src1IndirIndexVal,local_70,
                  (ExprHash *)((long)&arrayOpnd + 4));
  if (!bVar4) {
    return false;
  }
  valueInfo._4_4_ = arrayOpnd._4_4_;
  local_98 = ValueHashTable<ExprHash,_Value_*>::Get
                       ((block->globOptData).exprToValueMap,arrayOpnd._4_4_);
  if (local_98 == (Value **)0x0) {
    return false;
  }
  symStore = (Sym *)0x0;
  val = (Value *)0x0;
  symStoreVal = (Value *)0x0;
  pOVar13 = IR::Instr::GetDst(*instrRef);
  if (pOVar13 == (Opnd *)0x0) {
LAB_005fd8e8:
    pOVar13 = IR::Instr::GetSrc1(*instrRef);
    if (pOVar13 != (Opnd *)0x0) {
      if (src2Val == (Value *)0x0) {
        return false;
      }
      VVar9 = ExprHash::GetSrc1ValueNumber((ExprHash *)((long)&arrayOpnd + 4));
      VVar10 = ::Value::GetValueNumber(src2Val);
      if (VVar9 != VVar10) {
        return false;
      }
      propOpnd = (PropertySymOpnd *)IR::Instr::GetSrc1(*instrRef);
      bVar4 = IR::Opnd::IsSymOpnd((Opnd *)propOpnd);
      if (bVar4) {
        pSVar16 = IR::Opnd::AsSymOpnd((Opnd *)propOpnd);
        bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar16);
        if (bVar4) {
          if ((*instrRef)->m_opcode != CheckFixedFld) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                               ,0x280,"(instr->m_opcode == Js::OpCode::CheckFixedFld)",
                               "instr->m_opcode == Js::OpCode::CheckFixedFld");
            if (!bVar4) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          pSVar16 = IR::Opnd::AsSymOpnd((Opnd *)propOpnd);
          pPStack_d8 = IR::Opnd::AsPropertySymOpnd(&pSVar16->super_Opnd);
          bVar4 = IR::PropertySymOpnd::IsTypeChecked(pPStack_d8);
          if ((!bVar4) &&
             (bVar4 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(pPStack_d8), !bVar4)
             ) {
            return false;
          }
        }
      }
      pOVar13 = IR::Instr::GetSrc2(*instrRef);
      if (pOVar13 != (Opnd *)0x0) {
        if (src1IndirIndexVal == (Value *)0x0) {
          return false;
        }
        VVar9 = ExprHash::GetSrc2ValueNumber((ExprHash *)((long)&arrayOpnd + 4));
        VVar10 = ::Value::GetValueNumber(src1IndirIndexVal);
        if (VVar9 != VVar10) {
          return false;
        }
      }
    }
    src1_1._7_1_ = 0;
    bVar4 = MayNeedBailOnImplicitCall(*instrRef,src2Val,src1IndirIndexVal);
    if (bVar4) {
      src1_1._7_1_ = 1;
      sym1 = (StackSym *)IR::Instr::GetSrc1(*instrRef);
      if (((((*instrRef)->m_opcode != StElemI_A) && ((*instrRef)->m_opcode != StElemI_A_Strict)) &&
          (sym1 != (StackSym *)0x0)) && (bVar4 = IR::Opnd::IsRegOpnd((Opnd *)sym1), bVar4)) {
        pRVar14 = IR::Opnd::AsRegOpnd((Opnd *)sym1);
        src2 = (Opnd *)pRVar14->m_sym;
        bVar4 = GlobOptBlockData::IsTypeSpecialized(&block->globOptData,(Sym *)src2);
        if ((bVar4) ||
           (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((block->globOptData).liveInt32Syms,*(BVIndex *)&src2[1]._vptr_Opnd),
           BVar5 != '\0')) {
          sym2 = (StackSym *)IR::Instr::GetSrc2(*instrRef);
          if ((sym2 == (StackSym *)0x0) || (bVar4 = IR::Opnd::IsImmediateOpnd((Opnd *)sym2), bVar4))
          {
            src1_1._7_1_ = 0;
          }
          else {
            bVar4 = IR::Opnd::IsRegOpnd((Opnd *)sym2);
            if (bVar4) {
              pRVar14 = IR::Opnd::AsRegOpnd((Opnd *)sym2);
              src1_2 = (Opnd *)pRVar14->m_sym;
              bVar4 = GlobOptBlockData::IsTypeSpecialized(&block->globOptData,(Sym *)src1_2);
              if ((bVar4) ||
                 (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                                    ((block->globOptData).liveInt32Syms,
                                     *(BVIndex *)&src1_2[1]._vptr_Opnd), BVar5 != '\0')) {
                src1_1._7_1_ = 0;
              }
            }
          }
        }
      }
    }
    if ((((src1_1._7_1_ & 1) != 0) &&
        (varSym1 = (StackSym *)IR::Instr::GetSrc1(*instrRef), varSym1 != (StackSym *)0x0)) &&
       (bVar4 = IR::Opnd::IsRegOpnd((Opnd *)varSym1), bVar4)) {
      pRVar14 = IR::Opnd::AsRegOpnd((Opnd *)varSym1);
      src2_1 = (Opnd *)pRVar14->m_sym;
      bVar4 = StackSym::IsTypeSpec((StackSym *)src2_1);
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x2c4,"(!varSym1->IsTypeSpec())","!varSym1->IsTypeSpec()");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((block->globOptData).liveFields,*(BVIndex *)&src2_1[1]._vptr_Opnd);
      if (BVar5 == '\0') {
        return false;
      }
      varSym2 = (StackSym *)IR::Instr::GetSrc2(*instrRef);
      if ((varSym2 != (StackSym *)0x0) && (bVar4 = IR::Opnd::IsRegOpnd((Opnd *)varSym2), bVar4)) {
        pRVar14 = IR::Opnd::AsRegOpnd((Opnd *)varSym2);
        dst = (Opnd *)pRVar14->m_sym;
        bVar4 = StackSym::IsTypeSpec((StackSym *)dst);
        if (bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                             ,0x2ce,"(!varSym2->IsTypeSpec())","!varSym2->IsTypeSpec()");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((block->globOptData).liveFields,*(BVIndex *)&dst[1]._vptr_Opnd);
        if (BVar5 == '\0') {
          return false;
        }
      }
    }
    pOVar13 = IR::Instr::GetDst(*instrRef);
    if (pOVar13 != (Opnd *)0x0) {
      pOVar13 = IR::Instr::GetDst(*instrRef);
      IVar6 = IR::Opnd::GetType(pOVar13);
      pSVar17 = Sym::AsStackSym((Sym *)val);
      IVar7 = StackSym::GetType(pSVar17);
      if (IVar6 != IVar7) {
        bVar4 = GetIsAsmJSFunc(this);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                             ,0x2dc,"(GetIsAsmJSFunc())","GetIsAsmJSFunc()");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        return false;
      }
    }
    if ((*instrRef)->m_opcode == ExtendArg_A) {
      dstVal = (Value *)IR::Instr::GetDst(*instrRef);
      cseOpnd = (Opnd *)GlobOptBlockData::FindValue(&this->currentBlock->globOptData,(Sym *)val);
      GlobOptBlockData::SetValue(&this->currentBlock->globOptData,(Value *)cseOpnd,(Opnd *)dstVal);
      pRVar14 = IR::Opnd::AsRegOpnd((Opnd *)dstVal);
      pSVar17 = pRVar14->m_sym;
      symSrc = Sym::AsStackSym((Sym *)val);
      StackSym::CopySymAttrs(pSVar17,symSrc);
      this_local._7_1_ = false;
    }
    else {
      uVar8 = Func::GetSourceContextId(this->func);
      uVar11 = Func::GetLocalFunctionId(this->func);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,CSEPhase,uVar8,uVar11);
      if (bVar4) {
        pJVar18 = Func::GetJITFunctionBody(this->func);
        pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar18);
        Output::Print(L" --- CSE (%s): ",pcVar19);
        IR::Instr::Dump(*instrRef);
      }
      uVar8 = Func::GetSourceContextId(this->func);
      uVar11 = Func::GetLocalFunctionId(this->func);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,CSEPhase,uVar8,uVar11);
      if (bVar4) {
        pJVar18 = Func::GetJITFunctionBody(this->func);
        pcVar19 = JITTimeFunctionBody::GetDisplayName(pJVar18);
        pcVar20 = Js::OpCodeUtil::GetOpCodeName((*instrRef)->m_opcode);
        Output::Print(L" --- CSE (%s): %s\n",pcVar19,pcVar20);
      }
      CaptureByteCodeSymUses(this,*instrRef);
      pOVar13 = IR::Instr::GetDst(*instrRef);
      if (pOVar13 == (Opnd *)0x0) {
        (*instrRef)->m_opcode = Nop;
        this_local._7_1_ = true;
      }
      else {
        if (symStore == (Sym *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                             ,0x305,"(valueInfo)","valueInfo");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        pSVar17 = Sym::AsStackSym((Sym *)val);
        pOVar13 = IR::Instr::GetDst(*instrRef);
        IVar6 = IR::Opnd::GetType(pOVar13);
        pAVar21 = (AddrOpnd *)IR::RegOpnd::New(pSVar17,IVar6,(*instrRef)->m_func);
        _intConstantValue = pAVar21;
        paVar22 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                  ValueInfo::Type((ValueInfo *)symStore);
        local_13a.field_0 = *paVar22;
        IR::Opnd::SetValueType((Opnd *)pAVar21,(ValueType)local_13a.field_0);
        IR::Opnd::SetIsJITOptimizedReg(&_intConstantValue->super_Opnd,true);
        if ((src1_1._7_1_ & 1) != 0) {
          CaptureNoImplicitCallUses(this,&_intConstantValue->super_Opnd,false,(Instr *)0x0);
        }
        bVar4 = ValueInfo::TryGetIntConstantValue((ValueInfo *)symStore,&local_140,false);
        if ((bVar4) &&
           (bVar4 = ValueType::IsIntAndLikelyTagged((ValueType *)&symStore->m_next), bVar4)) {
          IR::Opnd::Free(&_intConstantValue->super_Opnd,this->func);
          address = Js::TaggedInt::ToVarUnchecked(local_140);
          pAVar21 = IR::AddrOpnd::New(address,AddrOpndKindConstantVar,(*instrRef)->m_func,false,
                                      (Var)0x0);
          _intConstantValue = pAVar21;
          paVar23 = &ValueInfo::Type((ValueInfo *)symStore)->field_0;
          IR::Opnd::SetValueType
                    (&pAVar21->super_Opnd,
                     (ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar23->field_0);
        }
        *pSrc1Val = symStoreVal;
        instr_00 = *instrRef;
        pOVar13 = IR::Instr::GetDst(*instrRef);
        pIVar24 = IR::Instr::New(Ld_A,pOVar13,&_intConstantValue->super_Opnd,(*instrRef)->m_func);
        *instrRef = pIVar24;
        IR::Instr::SetByteCodeOffset(*instrRef,instr_00);
        IR::Instr::TransferDstAttributesTo(instr_00,*instrRef);
        BasicBlock::InsertInstrBefore(block,*instrRef,instr_00);
        BasicBlock::RemoveInstr(block,instr_00);
        *pSrc2Val = (Value *)0x0;
        *pSrc1IndirIndexVal = (Value *)0x0;
        this_local._7_1_ = true;
      }
    }
    return this_local._7_1_;
  }
  if (*local_98 == (Value *)0x0) {
    return false;
  }
  symStoreVal = *local_98;
  if ((hash._3_1_ & 1) != 0) {
    this_00 = (block->globOptData).liveArrayValues;
    uVar8 = ExprHash::operator_cast_to_unsigned_int((ExprHash *)((long)&arrayOpnd + 4));
    BVar5 = BVSparse<Memory::JitArenaAllocator>::Test(this_00,uVar8);
    if (BVar5 == '\0') {
      return false;
    }
  }
  symStore = (Sym *)::Value::GetValueInfo(symStoreVal);
  val = (Value *)ValueInfo::GetSymStore((ValueInfo *)symStore);
  pVStack_c0 = (Value *)0x0;
  if (((Sym *)val == (Sym *)0x0) &&
     (bVar4 = ValueInfo::TryGetIntConstantValue
                        ((ValueInfo *)symStore,(int32 *)((long)&src1 + 4),false), bVar4)) {
    if ((hash._3_1_ & 1) == 0) {
      return false;
    }
    bVar4 = ValueType::IsIntAndLikelyTagged((ValueType *)&symStore->m_next);
    if (!bVar4) {
      return false;
    }
    val = (Value *)GetTaggedIntConstantStackSym(this,src1._4_4_);
  }
  if ((val == (Value *)0x0) || (bVar4 = Sym::IsStackSym((Sym *)val), !bVar4)) {
    return false;
  }
  pVStack_c0 = GlobOptBlockData::FindValue(&block->globOptData,(Sym *)val);
  if (pVStack_c0 != (Value *)0x0) {
    VVar9 = ::Value::GetValueNumber(pVStack_c0);
    VVar10 = ::Value::GetValueNumber(symStoreVal);
    if (VVar9 == VVar10) {
      symStoreVal = pVStack_c0;
      symStore = (Sym *)::Value::GetValueInfo(pVStack_c0);
      goto LAB_005fd8e8;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::CSEOptimize(BasicBlock *block, IR::Instr * *const instrRef, Value **pSrc1Val, Value **pSrc2Val, Value **pSrc1IndirIndexVal, bool intMathExprOnly)
{
    Assert(instrRef);
    IR::Instr *&instr = *instrRef;
    Assert(instr);
    if (!this->DoCSE())
    {
        return false;
    }

    Value *src1Val = *pSrc1Val;
    Value *src2Val = *pSrc2Val;
    Value *src1IndirIndexVal = *pSrc1IndirIndexVal;
    bool isArray = false;
    ExprAttributes exprAttributes;
    ExprHash hash;

    // For arrays, hash the value # of the baseOpnd and indexOpnd
    switch(instr->m_opcode)
    {
        case Js::OpCode::LdArrViewElem:
        case Js::OpCode::LdElemI_A:
        {
            if(intMathExprOnly)
            {
                return false;
            }

            IR::IndirOpnd *arrayOpnd = instr->GetSrc1()->AsIndirOpnd();

            src1Val = block->globOptData.FindValue(arrayOpnd->GetBaseOpnd()->m_sym);
            if(src1IndirIndexVal)
            {
                src2Val = src1IndirIndexVal;
            }
            else if (arrayOpnd->GetIndexOpnd())
            {
                src2Val = block->globOptData.FindValue(arrayOpnd->GetIndexOpnd()->m_sym);
            }
            else
            {
                return false;
            }
            // for typed array do not add instructions whose dst are guaranteed to be int or number
            // as we will try to eliminate bound check for these typed arrays
            if (src1Val->GetValueInfo()->IsLikelyOptimizedVirtualTypedArray())
            {
                exprAttributes = DstIsIntOrNumberAttributes(!instr->dstIsAlwaysConvertedToInt32, !instr->dstIsAlwaysConvertedToNumber);
            }
            isArray = true;
            break;
        }

        case Js::OpCode::Neg_A:
        case Js::OpCode::Add_A:
        case Js::OpCode::Sub_A:
        case Js::OpCode::Mul_A:
        case Js::OpCode::Div_A:
        case Js::OpCode::Rem_A:
        case Js::OpCode::ShrU_A:
            // If the previously-computed matching expression ignored int overflow or negative zero, those attributes must match
            // to be able to CSE this expression
            if(intMathExprOnly && !ignoredIntOverflowForCurrentInstr && !ignoredNegativeZeroForCurrentInstr)
            {
                // Already tried CSE with default attributes
                return false;
            }
            exprAttributes = IntMathExprAttributes(ignoredIntOverflowForCurrentInstr, ignoredNegativeZeroForCurrentInstr);
            break;

        case Js::OpCode::Conv_Prim:
        case Js::OpCode::Conv_Prim_Sat:
            exprAttributes = ConvAttributes(instr->GetDst()->IsUnsigned(), instr->GetSrc1()->IsUnsigned());
            break;

        default:
            if(intMathExprOnly)
            {
                return false;
            }
            break;
    }

    if (!this->GetHash(instr, src1Val, src2Val, exprAttributes, &hash))
    {
        return false;
    }

    // See if we have a value for that expression
    Value ** pVal = block->globOptData.exprToValueMap->Get(hash);

    if (pVal == NULL)
    {
        return false;
    }

    ValueInfo *valueInfo = NULL;
    Sym *symStore = NULL;
    Value *val = NULL;

    if (instr->GetDst())
    {

        if (*pVal == NULL)
        {
            return false;
        }

        val = *pVal;

        // Make sure the array value is still live.  We can't CSE something like:
        //    ... = A[i];
        //   B[j] = ...;
        //    ... = A[i];
        if (isArray && !block->globOptData.liveArrayValues->Test(hash))
        {
            return false;
        }

        // See if the symStore is still valid
        valueInfo = val->GetValueInfo();
        symStore = valueInfo->GetSymStore();
        Value * symStoreVal = NULL;

        int32 intConstantValue;
        if (!symStore && valueInfo->TryGetIntConstantValue(&intConstantValue))
        {
            // Handle:
            //  A[i] = 10;
            //    ... = A[i];
            if (!isArray)
            {
                return false;
            }
            if (!valueInfo->IsIntAndLikelyTagged())
            {
                return false;
            }

            symStore = GetTaggedIntConstantStackSym(intConstantValue);
        }

        if(!symStore || !symStore->IsStackSym())
        {
            return false;
        }
        symStoreVal = block->globOptData.FindValue(symStore);

        if (!symStoreVal || symStoreVal->GetValueNumber() != val->GetValueNumber())
        {
            return false;
        }
        val = symStoreVal;
        valueInfo = val->GetValueInfo();
    }

    // Make sure srcs still have same values

    if (instr->GetSrc1())
    {
        if (!src1Val)
        {
            return false;
        }
        if (hash.GetSrc1ValueNumber() != src1Val->GetValueNumber())
        {
            return false;
        }

        IR::Opnd *src1 = instr->GetSrc1();

        if (src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd())
        {
            Assert(instr->m_opcode == Js::OpCode::CheckFixedFld);
            IR::PropertySymOpnd *propOpnd = src1->AsSymOpnd()->AsPropertySymOpnd();

            if (!propOpnd->IsTypeChecked() && !propOpnd->IsRootObjectNonConfigurableFieldLoad())
            {
                // Require m_CachedTypeChecked for 2 reasons:
                // - We may be relying on this instruction to do a type check for a downstream reference.
                // - This instruction may have a different inline cache, and thus need to check a different type,
                //   than the upstream check.
                // REVIEW: We could process this differently somehow to get the type check on the next reference.
                return false;
            }
        }
        if (instr->GetSrc2())
        {
            if (!src2Val)
            {
                return false;
            }
            if (hash.GetSrc2ValueNumber() != src2Val->GetValueNumber())
            {
                return false;
            }
        }
    }
    bool needsBailOnImplicitCall = false;

    // Need implicit call bailouts?
    if (this->MayNeedBailOnImplicitCall(instr, src1Val, src2Val))
    {
        needsBailOnImplicitCall = true;

        IR::Opnd *src1 = instr->GetSrc1();

        if (instr->m_opcode != Js::OpCode::StElemI_A && instr->m_opcode != Js::OpCode::StElemI_A_Strict
            && src1 && src1->IsRegOpnd())
        {
            StackSym *sym1 = src1->AsRegOpnd()->m_sym;

            if (block->globOptData.IsTypeSpecialized(sym1) || block->globOptData.liveInt32Syms->Test(sym1->m_id))
            {
                IR::Opnd *src2 = instr->GetSrc2();

                if (!src2 || src2->IsImmediateOpnd())
                {
                    needsBailOnImplicitCall = false;
                }
                else if (src2->IsRegOpnd())
                {
                    StackSym *sym2 = src2->AsRegOpnd()->m_sym;
                    if (block->globOptData.IsTypeSpecialized(sym2) || block->globOptData.liveInt32Syms->Test(sym2->m_id))
                    {
                        needsBailOnImplicitCall = false;
                    }
                }
            }
        }
    }

    if (needsBailOnImplicitCall)
    {
        IR::Opnd *src1 = instr->GetSrc1();
        if (src1)
        {
            if (src1->IsRegOpnd())
            {
                StackSym *varSym1 = src1->AsRegOpnd()->m_sym;

                Assert(!varSym1->IsTypeSpec());
                if (!block->globOptData.liveFields->Test(varSym1->m_id))
                {
                    return false;
                }
                IR::Opnd *src2 = instr->GetSrc2();
                if (src2 && src2->IsRegOpnd())
                {
                    StackSym *varSym2 = src2->AsRegOpnd()->m_sym;

                    Assert(!varSym2->IsTypeSpec());
                    if (!block->globOptData.liveFields->Test(varSym2->m_id))
                    {
                        return false;
                    }
                }
            }
        }
    }
    // in asmjs we can have a symstore with a different type
    //  x = HEAPF32[i >> 2]
    //  y  = HEAPI32[i >> 2]
    if (instr->GetDst() && (instr->GetDst()->GetType() != symStore->AsStackSym()->GetType()))
    {
        Assert(GetIsAsmJSFunc());
        return false;
    }

    // SIMD_JS
    if (instr->m_opcode == Js::OpCode::ExtendArg_A)
    {
        // we don't want to CSE ExtendArgs, only the operation using them. To do that, we mimic CSE by transferring the symStore valueInfo to the dst.
        IR::Opnd *dst = instr->GetDst();
        Value *dstVal = this->currentBlock->globOptData.FindValue(symStore);
        this->currentBlock->globOptData.SetValue(dstVal, dst);
        dst->AsRegOpnd()->m_sym->CopySymAttrs(symStore->AsStackSym());
        return false;
    }

    //
    // Success, do the CSE rewrite.
    //

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::CSEPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        Output::Print(_u(" --- CSE (%s): "), this->func->GetJITFunctionBody()->GetDisplayName());
        instr->Dump();
    }
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::CSEPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        Output::Print(_u(" --- CSE (%s): %s\n"), this->func->GetJITFunctionBody()->GetDisplayName(), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
    }
#endif

    this->CaptureByteCodeSymUses(instr);

    if (!instr->GetDst())
    {
        instr->m_opcode = Js::OpCode::Nop;
        return true;
    }

    AnalysisAssert(valueInfo);

    IR::Opnd *cseOpnd;

    cseOpnd = IR::RegOpnd::New(symStore->AsStackSym(), instr->GetDst()->GetType(), instr->m_func);
    cseOpnd->SetValueType(valueInfo->Type());
    cseOpnd->SetIsJITOptimizedReg(true);

    if (needsBailOnImplicitCall)
    {
        this->CaptureNoImplicitCallUses(cseOpnd, false);
    }

    int32 intConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue) && valueInfo->IsIntAndLikelyTagged())
    {
        cseOpnd->Free(func);
        cseOpnd = IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked(intConstantValue), IR::AddrOpndKindConstantVar, instr->m_func);
        cseOpnd->SetValueType(valueInfo->Type());
    }

    *pSrc1Val = val;

    {
        // Profiled instructions have data that is interpreted differently based on the op code. Since we're changing the op
        // code and due to other similar potential issues, always create a new instr instead of changing the existing one.
        IR::Instr *const originalInstr = instr;
        instr = IR::Instr::New(Js::OpCode::Ld_A, instr->GetDst(), cseOpnd, instr->m_func);
        instr->SetByteCodeOffset(originalInstr);
        originalInstr->TransferDstAttributesTo(instr);
        block->InsertInstrBefore(instr, originalInstr);
        block->RemoveInstr(originalInstr);
    }

    *pSrc2Val = NULL;
    *pSrc1IndirIndexVal = NULL;
    return true;
}